

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_exponent<char,fmt::v8::appender>(int exp,appender it)

{
  undefined1 uVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar5 = (ulong)(uint)exp;
  uVar6 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) + 1;
  if (exp < 0) {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar6) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar3) = 0x2d;
    uVar5 = (ulong)(uint)-exp;
  }
  else {
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar6) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
     lVar3) = 0x2b;
  }
  uVar4 = (uint)uVar5;
  if (99 < (int)uVar4) {
    if (999 < (int)uVar4) {
      uVar1 = (&basic_data<void>::digits)[(uVar5 / 100) * 2];
      if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                    0x18) <
          *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10) + 1U) {
        (*(code *)**(undefined8 **)
                    it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                  (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      }
      lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 0x10);
      *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10
               ) = lVar3 + 1;
      *(undefined1 *)
       (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
       + lVar3) = uVar1;
    }
    cVar2 = "0010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(uVar5 / 100) * 2];
    if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    uVar4 = uVar4 + (int)(uVar5 / 100) * -100;
    lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container + 8) + lVar3) = cVar2;
  }
  uVar1 = (&basic_data<void>::digits)[(ulong)uVar4 * 2];
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10
               ) + 1U) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
  }
  lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       lVar3 + 1;
  *(undefined1 *)
   (*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8) +
   lVar3) = uVar1;
  cVar2 = "0010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          [(ulong)uVar4 * 2];
  if (*(ulong *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10
               ) + 1U) {
    (*(code *)**(undefined8 **)
                it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
              (it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
  }
  lVar3 = *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                   0x10);
  *(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10) =
       lVar3 + 1;
  *(char *)(*(long *)((long)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 8) + lVar3) = cVar2;
  return (appender)it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container
  ;
}

Assistant:

auto write_exponent(int exp, It it) -> It {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits[exp / 100];
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits[exp];
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}